

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# png.cpp
# Opt level: O2

Image * rw::readPNG(char *filename)

{
  FILE *__stream;
  uint code;
  uint8 *puVar1;
  Image *this;
  char *pcVar2;
  size_t __n;
  undefined8 uStack_240;
  uint32 h;
  uint32 w;
  uint8 *raw;
  uint32 length;
  Error _e;
  LodePNGState state;
  
  puVar1 = getFileContents(filename,&length);
  lodepng_state_init(&state);
  raw = (uint8 *)0x0;
  state.decoder.color_convert = 0;
  code = lodepng_decode(&raw,&w,&h,&state,puVar1,(ulong)length);
  if (code != 0) {
    uStack_240 = 0x25;
LAB_0010c6ae:
    _e.plugin = 0;
    _e.code = 0x80000001;
    fprintf(_stderr,"%s:%d: ",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/AGraber[P]librw/src/png.cpp",
            uStack_240);
    __stream = _stderr;
    pcVar2 = lodepng_error_text(code);
    pcVar2 = dbgsprint(0x80000001,pcVar2);
    fprintf(__stream,"%s\n",pcVar2);
    setError(&_e);
    return (Image *)0x0;
  }
  if (state.info_raw.colortype == LCT_PALETTE && state.info_raw.bitdepth == 4) {
    this = Image::create(w,h,4);
    Image::allocate(this);
    memcpy(this->palette,state.info_raw.palette,state.info_raw.palettesize << 2);
    expandPal4_BE(this->pixels,this->stride,raw,w >> 1,w,h);
    goto LAB_0010c663;
  }
  if (state.info_raw.bitdepth != 8) {
    this = (Image *)0x0;
    goto LAB_0010c663;
  }
  if (state.info_raw.colortype == LCT_RGB) {
    this = Image::create(w,h,0x18);
    Image::allocate(this);
    puVar1 = this->pixels;
    __n = (size_t)(w * h * 3);
  }
  else {
    if (state.info_raw.colortype != LCT_RGBA) {
      if (state.info_raw.colortype == LCT_PALETTE) {
        this = Image::create(w,h,(uint)(0x10 < state.info_raw.palettesize) * 4 + 4);
        Image::allocate(this);
        memcpy(this->palette,state.info_raw.palette,state.info_raw.palettesize << 2);
        puVar1 = this->pixels;
        __n = (size_t)(h * w);
        goto LAB_0010c65e;
      }
      free(raw);
      lodepng_state_init(&state);
      code = lodepng_decode(&raw,&w,&h,&state,puVar1,(ulong)length);
      if (code != 0) {
        uStack_240 = 0x41;
        goto LAB_0010c6ae;
      }
    }
    this = Image::create(w,h,0x20);
    Image::allocate(this);
    puVar1 = this->pixels;
    __n = (size_t)(w * h * 4);
  }
LAB_0010c65e:
  memcpy(puVar1,raw,__n);
LAB_0010c663:
  free(raw);
  return this;
}

Assistant:

Image*
readPNG(const char *filename)
{
	Image *image = nil;
	uint32 length;
	uint8 *data = getFileContents(filename, &length);
	assert(data != nil);

	LodePNGState state;
	lodepng_state_init(&state);
	uint8 *raw = nil;
	uint32 w, h;

	// First try: decode without conversion to see if we understand the format
	state.decoder.color_convert = 0;
	uint32 error = lodepng_decode(&raw, &w, &h, &state, data, length);
	if(error){
		RWERROR((ERR_GENERAL, lodepng_error_text(error)));
		return nil;
	}

	if(state.info_raw.bitdepth == 4 && state.info_raw.colortype == LCT_PALETTE){
		image = Image::create(w, h, 4);
		image->allocate();
		memcpy(image->palette, state.info_raw.palette, state.info_raw.palettesize*4);
		expandPal4_BE(image->pixels, image->stride, raw, w/2, w, h);
	}else if(state.info_raw.bitdepth == 8){
		switch(state.info_raw.colortype){
		case LCT_PALETTE:
			image = Image::create(w, h, state.info_raw.palettesize <= 16 ? 4 : 8);
			image->allocate();
			memcpy(image->palette, state.info_raw.palette, state.info_raw.palettesize*4);
			memcpy(image->pixels, raw, w*h);
			break;
		case LCT_RGB:
			image = Image::create(w, h, 24);
			image->allocate();
			memcpy(image->pixels, raw, w*h*3);
			break;
		default:
			// Second try: just load as 32 bit
			free(raw);
			lodepng_state_init(&state);
			error = lodepng_decode(&raw, &w, &h, &state, data, length);
			if(error){
				RWERROR((ERR_GENERAL, lodepng_error_text(error)));
				return nil;
			}
			// fall through
		case LCT_RGBA:
			image = Image::create(w, h, 32);
			image->allocate();
			memcpy(image->pixels, raw, w*h*4);
			break;
		}
	}

	free(raw);	// TODO: maybe override lodepng allocator

	return image;
}